

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal-info.c
# Opt level: O3

int main(int argc,char **argv)

{
  int32_t iVar1;
  char *__filename;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  wal_dk_header *pwVar4;
  undefined8 *puVar5;
  ulong uVar6;
  byte bVar7;
  char buffer [892];
  wal_q2_header header_q2;
  undefined8 uStack_a98;
  uint local_a78;
  uint local_a74;
  uint local_a70 [4];
  undefined1 local_a60 [24];
  undefined1 local_a48 [8];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a28;
  uint local_a24;
  byte abStack_a1d [765];
  uint local_720;
  uchar local_718 [896];
  wal_dk_header local_398;
  
  bVar7 = 0;
  __filename = cli_concat_args(argc,argv);
  if (argc < 2) {
    puts("Usage: wal-info texture.wal");
    return -1;
  }
  if (__filename != (char *)0x0) {
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      perror("Could not open file");
    }
    else {
      sVar2 = fread(local_718,1,0x37c,__stream);
      if (99 < sVar2) {
        iVar1 = wal_get_type(local_718);
        if (iVar1 == 2) {
          wal_dk_read_header(local_718,&local_398);
          puts("Type: Daikatana");
          memcpy(&uStack_a98,&local_398,0x37c);
          printf("Name: %.*s\n",0x20,(long)&uStack_a98 + 4);
          printf("Width: %d\n",(ulong)local_a74);
          printf("Height: %d\n",(ulong)local_a70[0]);
          uVar6 = 0;
          do {
            printf("MIP %d offset: %#010x\n",uVar6 & 0xffffffff,(ulong)local_a70[uVar6 + 1]);
            uVar6 = uVar6 + 1;
          } while (uVar6 != 9);
          printf("Next frame name: %.*s\n",0x20,local_a48);
          printf("Flags: %#010x\n",(ulong)local_a28);
          printf("Contents: %#010x\n",(ulong)local_a24);
          printf("Value: %#010x\n",(ulong)local_720);
          puts("Palette:");
          uVar6 = 0xfffffffffffffffd;
          do {
            printf("#%02x%02x%02x\n",(ulong)abStack_a1d[uVar6],(ulong)abStack_a1d[uVar6 + 1],
                   (ulong)abStack_a1d[uVar6 + 2]);
            uVar6 = uVar6 + 3;
          } while (uVar6 < 0xfd);
        }
        else {
          if (iVar1 != 1) {
            puts("File type not supported - check if it\'s really a WAL");
            goto LAB_0010267d;
          }
          wal_q2_read_header(local_718,(wal_q2_header *)&local_398);
          puts("Type: Quake 2");
          pwVar4 = &local_398;
          puVar5 = &uStack_a98;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar5 = *(undefined8 *)&pwVar4->version;
            pwVar4 = (wal_dk_header *)((long)pwVar4 + (ulong)bVar7 * -0x10 + 8);
            puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          }
          local_a38._0_1_ = local_398.animname[0x10];
          local_a38._1_1_ = local_398.animname[0x11];
          local_a38._2_1_ = local_398.animname[0x12];
          local_a38._3_1_ = local_398.animname[0x13];
          printf("Name: %.*s\n",0x20,&uStack_a98);
          printf("Width: %d\n",(ulong)local_a78);
          printf("Height: %d\n",(ulong)local_a74);
          uVar6 = 0;
          do {
            printf("MIP %d offset: %#010x\n",uVar6 & 0xffffffff,(ulong)local_a70[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar6 != 4);
          printf("Next frame name: %.*s\n",0x20,local_a60);
          printf("Flags: %#010x\n",(ulong)local_a40);
          printf("Contents: %#010x\n",(ulong)local_a3c);
          printf("Value: %#010x\n",(ulong)local_a38);
        }
        fclose(__stream);
        return 0;
      }
      main_cold_1();
    }
  }
LAB_0010267d:
  printf("File path: %s\n",__filename);
  return 1;
}

Assistant:

int main(int argc, const char *argv[])
{
	FILE *fp;
	struct wal_q2_header header_q2;
	struct wal_dk_header header_dk;
	char *path = cli_concat_args(argc, argv);
	char buffer[WAL_DK_HEADER_SIZE]; /* Daikatana's header is bigger */
	const unsigned char *buf_ptr = (const unsigned char *)&buffer;

	if (argc < 2) {
		printf("Usage: wal-info texture.wal\n");
		return -1;
	}
	if (!path) {
		goto on_err;
	}
	fp = fopen(path, "r");
	if (!fp) {
		perror("Could not open file");
		goto on_err;
	}
	size_t total_len = fread(&buffer, 1, WAL_DK_HEADER_SIZE, fp);
	if (total_len < WAL_Q2_HEADER_SIZE) {
		fprintf(stderr, "Unable to read enough bytes to parse the header\n");
		goto on_err;
	}
	int32_t type = wal_get_type(buf_ptr);
	switch (type) {
		case WAL_TYPE_QUAKE2:
			wal_q2_read_header(buf_ptr, &header_q2);
			printf("Type: Quake 2\n");
			print_info_q2(header_q2);
			break;
		case WAL_TYPE_DAIKATANA:
			wal_dk_read_header(buf_ptr, &header_dk);
			printf("Type: Daikatana\n");
			print_info_dk(header_dk);
			break;
		default:
			printf("File type not supported - check if it's really a WAL\n");
			goto on_err;
	}
	fclose(fp);
	return 0;

on_err:
	printf("File path: %s\n", path);
	return 1;
}